

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int need_nhdr_swap(short dim0,int hdrsize)

{
  uint uVar1;
  int iVar2;
  short d0;
  int hsize;
  
  d0 = dim0;
  hsize = hdrsize;
  if (dim0 == 0) {
    if (hdrsize == 0x15c) {
      return 0;
    }
    nifti_swap_4bytes(1,&hsize);
    if (hsize == 0x15c) {
      return 1;
    }
    iVar2 = -2;
    if (g_opts_0 < 2) {
      return -2;
    }
    fprintf(_stderr,"** NIFTI: bad swapped hsize = %d, unswapped = ");
    nifti_swap_4bytes(1,&hsize);
    uVar1 = hsize;
  }
  else {
    if ((ushort)dim0 < 8) {
      return 0;
    }
    nifti_swap_2bytes(1,&d0);
    if ((ushort)(d0 - 1U) < 7) {
      return 1;
    }
    iVar2 = -1;
    if (g_opts_0 < 2) {
      return -1;
    }
    fprintf(_stderr,"** NIFTI: bad swapped d0 = %d, unswapped = ");
    nifti_swap_2bytes(1,&d0);
    uVar1 = (int)d0;
  }
  fprintf(_stderr,"%d\n",(ulong)uVar1);
  return iVar2;
}

Assistant:

static int need_nhdr_swap( short dim0, int hdrsize )
{
   short d0    = dim0;     /* so we won't have to swap them on the stack */
   int   hsize = hdrsize;

   if( d0 != 0 ){     /* then use it for the check */
      if( d0 > 0 && d0 <= 7 ) return 0;

      nifti_swap_2bytes(1, &d0);        /* swap? */
      if( d0 > 0 && d0 <= 7 ) return 1;

      if( g_opts.debug > 1 ){
         fprintf(stderr,"** NIFTI: bad swapped d0 = %d, unswapped = ", d0);
         nifti_swap_2bytes(1, &d0);        /* swap? */
         fprintf(stderr,"%d\n", d0);
      }

      return -1;        /* bad, naughty d0 */
   }

   /* dim[0] == 0 should not happen, but could, so try hdrsize */
   if( hsize == sizeof(nifti_1_header) ) return 0;

   nifti_swap_4bytes(1, &hsize);     /* swap? */
   if( hsize == sizeof(nifti_1_header) ) return 1;

   if( g_opts.debug > 1 ){
      fprintf(stderr,"** NIFTI: bad swapped hsize = %d, unswapped = ", hsize);
      nifti_swap_4bytes(1, &hsize);        /* swap? */
      fprintf(stderr,"%d\n", hsize);
   }

   return -2;     /* bad, naughty hsize */
}